

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH128_hash_t
XXH3_hashLong_128b_withSeed
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen)

{
  long lVar1;
  long lVar2;
  XXH3_f_scrambleAcc in_R9;
  XXH128_hash_t XVar3;
  xxh_u8 secret_1 [192];
  long local_c8 [25];
  
  if (seed64 != 0) {
    lVar2 = 0;
    do {
      lVar1 = *(long *)(XXH3_kSecret + lVar2 + 8);
      *(XXH64_hash_t *)((long)local_c8 + lVar2) = *(long *)(XXH3_kSecret + lVar2) + seed64;
      *(XXH64_hash_t *)((long)local_c8 + lVar2 + 8) = lVar1 - seed64;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0xc0);
    XVar3 = XXH3_hashLong_128b_internal
                      (input,len,(xxh_u8 *)local_c8,0xc0,(XXH3_f_accumulate_512)secretLen,in_R9);
    return XVar3;
  }
  XVar3 = XXH3_hashLong_128b_internal
                    (input,len,XXH3_kSecret,0xc0,(XXH3_f_accumulate_512)secretLen,in_R9);
  return XVar3;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_hashLong_128b_withSeed_internal(const void* XXH_RESTRICT input, size_t len,
                                XXH64_hash_t seed64,
                                XXH3_f_accumulate_512 f_acc512,
                                XXH3_f_scrambleAcc f_scramble,
                                XXH3_f_initCustomSecret f_initSec)
{
    if (seed64 == 0)
        return XXH3_hashLong_128b_internal(input, len,
                                           XXH3_kSecret, sizeof(XXH3_kSecret),
                                           f_acc512, f_scramble);
    {   XXH_ALIGN(XXH_SEC_ALIGN) xxh_u8 secret[XXH_SECRET_DEFAULT_SIZE];
        f_initSec(secret, seed64);
        return XXH3_hashLong_128b_internal(input, len, (const xxh_u8*)secret, sizeof(secret),
                                           f_acc512, f_scramble);
    }
}